

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O0

NamedPoint * __thiscall helics::Input::getValueRef<helics::NamedPoint>(Input *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  NamedPoint *pNVar4;
  int __c;
  char *in_RDI;
  defV *unaff_retaddr;
  DataType in_stack_0000000c;
  data_view *in_stack_00000010;
  defV val_1;
  defV val;
  NamedPoint out;
  data_view dv;
  Input *in_stack_00000230;
  double *in_stack_fffffffffffffee8;
  NamedPoint *in_stack_fffffffffffffef0;
  Input *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  shared_ptr<units::precise_unit> *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  data_view *dv_00;
  Input *in_stack_ffffffffffffff20;
  data_view local_c8;
  double local_98;
  NamedPoint local_60;
  NamedPoint *in_stack_ffffffffffffffd8;
  defV *in_stack_ffffffffffffffe0;
  
  pcVar3 = in_RDI;
  checkAndGetFedUpdate(in_stack_fffffffffffffef8);
  bVar1 = data_view::empty((data_view *)0x3ca056);
  if (bVar1) {
    pcVar3 = std::
             variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             ::index((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                      *)(in_RDI + 0x70),pcVar3,__c);
    helicsType<helics::NamedPoint>();
    bVar1 = checkForNeededCoreRetrieval
                      ((size_t)pcVar3,(DataType)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                       (DataType)in_stack_fffffffffffffef0);
    if (bVar1) {
      forceCoreDataUpdate(in_stack_ffffffffffffff20);
    }
  }
  else {
    if (*(int *)(in_RDI + 0x54) == -1) {
      loadSourceInformation(in_stack_00000230);
    }
    if ((in_RDI[0x58] & 1U) == 0) {
      helics::valueExtract(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
    }
    else {
      NamedPoint::NamedPoint(in_stack_fffffffffffffef0);
      if (*(int *)(in_RDI + 0x54) == 1) {
        local_98 = doubleExtractAndConvert
                             ((data_view *)
                              CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                              in_stack_ffffffffffffff08,
                              (shared_ptr<units::precise_unit> *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::variant<double,void,void,double,void>
                  ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                    *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        helics::valueExtract(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        std::
        variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                    *)0x3ca130);
      }
      else if (*(int *)(in_RDI + 0x54) == 2) {
        dv_00 = &local_c8;
        std::
        variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)0x3ca18e);
        integerExtractAndConvert
                  ((defV *)in_stack_ffffffffffffff20,dv_00,
                   (shared_ptr<units::precise_unit> *)
                   CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
        helics::valueExtract(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        std::
        variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                    *)0x3ca1d6);
      }
      else {
        helics::valueExtract
                  ((data_view *)
                   val.
                   super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   .
                   super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   ._M_u._24_8_,
                   val.
                   super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   .
                   super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   ._M_u._20_4_,
                   (NamedPoint *)
                   val.
                   super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   .
                   super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   .
                   super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                   ._M_u._8_8_);
      }
      uVar2 = changeDetected((defV *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                             (double)in_stack_fffffffffffffee8);
      if ((bool)uVar2) {
        pNVar4 = make_valid<helics::NamedPoint>(&local_60);
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                     *)CONCAT17(uVar2,in_stack_ffffffffffffff10),pNVar4);
      }
      NamedPoint::~NamedPoint((NamedPoint *)0x3ca283);
    }
  }
  pNVar4 = getValueRefImpl<helics::NamedPoint>((defV *)in_stack_fffffffffffffef0);
  data_view::~data_view((data_view *)0x3ca32d);
  return pNVar4;
}

Assistant:

const X& Input::getValueRef()
{
    static_assert(std::is_same<typeCategory<X>, std::integral_constant<int, primaryType>>::value,
                  "calling getValue By ref must be with a primary type");
    auto dv = checkAndGetFedUpdate();
    if (!dv.empty()) {
        if (injectionType == DataType::HELICS_UNKNOWN) {
            loadSourceInformation();
        }

        if (changeDetectionEnabled) {
            X out;
            if (injectionType == helics::DataType::HELICS_DOUBLE) {
                defV val = doubleExtractAndConvert(dv, inputUnits, outputUnits);
                valueExtract(val, out);
            } else if (injectionType == helics::DataType::HELICS_INT) {
                defV val;
                integerExtractAndConvert(val, dv, inputUnits, outputUnits);
                valueExtract(val, out);
            } else {
                valueExtract(dv, injectionType, out);
            }
            if (changeDetected(lastValue, out, delta)) {
                lastValue = make_valid(std::move(out));
            }
        } else {
            valueExtract(dv, injectionType, lastValue);
        }
    } else {
        if (checkForNeededCoreRetrieval(lastValue.index(),
                                        injectionType,
                                        helicsType<remove_cv_ref<X>>())) {
            forceCoreDataUpdate();
        }
    }

    return getValueRefImpl<remove_cv_ref<X>>(lastValue);
}